

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<signed_char,_signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::ModulusSimpleCase(char lhs,
                        SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        rhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            *result)

{
  bool bVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDX;
  undefined1 in_SIL;
  undefined1 in_DIL;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffed;
  undefined5 in_stack_fffffffffffffff8;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = in_SIL;
  bVar1 = ::operator!=((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,0x15987b);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::SignedCase((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                         )(char)((ulong)in_RDX >> 0x30),
                         (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)CONCAT17(in_SIL,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffed,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffffec,
                                                  in_stack_ffffffffffffffe8)))));
    if (!bVar1) {
      ::SafeInt::operator_cast_to_signed_char(in_RDX);
      SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                (unaff_retaddr,
                 (char *)CONCAT17(in_stack_ffffffffffffffff,
                                  CONCAT16(uVar2,CONCAT15(in_DIL,in_stack_fffffffffffffff8))));
    }
    return true;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }